

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::anon_unknown_5::ValidateTargetConstraints
          (anon_unknown_5 *this,Message *options,DescriptorPool *pool,
          ErrorCollector *error_collector,string_view file_name,OptionTargetType target_type)

{
  bool bVar1;
  Descriptor *type;
  Message *this_00;
  MessageLite *this_01;
  char *pcVar2;
  OptionTargetType target_type_00;
  string_view sVar3;
  string_view data;
  string_view file_name_00;
  string serialized;
  DynamicMessageFactory factory;
  LogMessageFatal local_a0;
  string local_90;
  DynamicMessageFactory local_70;
  
  target_type_00 = (OptionTargetType)file_name._M_str;
  pcVar2 = (char *)((ulong)file_name._M_str & 0xffffffff);
  sVar3 = MessageLite::GetTypeName((MessageLite *)this);
  type = DescriptorPool::FindMessageTypeByName((DescriptorPool *)options,sVar3);
  if (type == (Descriptor *)0x0) {
    sVar3._M_str = pcVar2;
    sVar3._M_len = file_name._M_len;
    bVar1 = ValidateTargetConstraintsRecursive
                      (this,(Message *)pool,error_collector,sVar3,target_type_00);
    return bVar1;
  }
  DynamicMessageFactory::DynamicMessageFactory(&local_70);
  this_00 = DynamicMessageFactory::GetPrototype(&local_70,type);
  this_01 = &Message::New(this_00)->super_MessageLite;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  bVar1 = MessageLite::SerializeToString((MessageLite *)this,&local_90);
  if (bVar1) {
    data._M_str = local_90._M_dataplus._M_p;
    data._M_len = local_90._M_string_length;
    bVar1 = MessageLite::ParseFromString(this_01,data);
    if (bVar1) {
      file_name_00._M_str = pcVar2;
      file_name_00._M_len = file_name._M_len;
      bVar1 = ValidateTargetConstraintsRecursive
                        ((anon_unknown_5 *)this_01,(Message *)pool,error_collector,file_name_00,
                         target_type_00);
      std::__cxx11::string::~string((string *)&local_90);
      (*this_01->_vptr_MessageLite[1])(this_01);
      DynamicMessageFactory::~DynamicMessageFactory(&local_70);
      return bVar1;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_a0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
               ,0x464,"dynamic_message->ParseFromString(serialized)");
  }
  else {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_a0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
               ,0x463,"options.SerializeToString(&serialized)");
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_a0);
}

Assistant:

bool ValidateTargetConstraints(const Message& options,
                               const DescriptorPool& pool,
                               DescriptorPool::ErrorCollector& error_collector,
                               absl::string_view file_name,
                               FieldOptions::OptionTargetType target_type) {
  const Descriptor* descriptor =
      pool.FindMessageTypeByName(options.GetTypeName());
  if (descriptor == nullptr) {
    // We were unable to find the options message in the descriptor pool. This
    // implies that the proto files we are working with do not depend on
    // descriptor.proto, in which case there are no custom options to worry
    // about. We can therefore skip the use of DynamicMessage.
    return ValidateTargetConstraintsRecursive(options, error_collector,
                                              file_name, target_type);
  } else {
    DynamicMessageFactory factory;
    std::unique_ptr<Message> dynamic_message(
        factory.GetPrototype(descriptor)->New());
    std::string serialized;
    ABSL_CHECK(options.SerializeToString(&serialized));
    ABSL_CHECK(dynamic_message->ParseFromString(serialized));
    return ValidateTargetConstraintsRecursive(*dynamic_message, error_collector,
                                              file_name, target_type);
  }
}